

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall PrimitiveTestClass::AddValues(PrimitiveTestClass *this)

{
  element_type *peVar1;
  char *pcVar2;
  uchar *puVar3;
  short *psVar4;
  unsigned_short *puVar5;
  int *piVar6;
  uint *puVar7;
  long *plVar8;
  unsigned_long *puVar9;
  longlong *plVar10;
  unsigned_long_long *puVar11;
  float *pfVar12;
  double *pdVar13;
  longdouble *plVar14;
  ulong *puVar15;
  ulong *puVar16;
  size_t i_1;
  size_t i_2;
  long lVar17;
  ulong uVar18;
  size_t i;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  __shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this->us = 0xffff;
  this->c = -1;
  this->uc = 0xff;
  this->s = -1;
  this->i = 0xfffff;
  this->ui = 0xfffff;
  this->l = 0xfffff;
  this->ul = 0xfffff;
  this->ll = 0xfffff;
  this->ull = 0xfffff;
  this->f = 1.342323;
  this->d = 432.324324324;
  this->ld = (longdouble)423432.3465435435;
  pcVar2 = (char *)operator_new__(0xd);
  this->str = pcVar2;
  builtin_strncpy(pcVar2,"Hello World!",0xd);
  pcVar2 = FillValues<char*>(this);
  this->pc = pcVar2;
  puVar3 = FillValues<unsigned_char*>(this);
  this->puc = puVar3;
  psVar4 = FillValues<short*>(this);
  this->ps = psVar4;
  puVar5 = FillValues<unsigned_short*>(this);
  this->pus = puVar5;
  piVar6 = FillValues<int*>(this);
  this->pi = piVar6;
  puVar7 = FillValues<unsigned_int*>(this);
  this->pui = puVar7;
  plVar8 = FillValues<long*>(this);
  this->pl = plVar8;
  puVar9 = FillValues<unsigned_long*>(this);
  this->pul = puVar9;
  plVar10 = FillValues<long_long*>(this);
  this->pll = plVar10;
  puVar11 = FillValues<unsigned_long_long*>(this);
  this->pull = puVar11;
  pfVar12 = FillValues<float*>(this);
  this->pf = pfVar12;
  pdVar13 = FillValues<double*>(this);
  this->pd = pdVar13;
  plVar14 = FillValues<long_double*>(this);
  this->pld = plVar14;
  uVar21 = (ulong)this->SIZE;
  lVar17 = uVar21 * 0x20;
  uVar18 = 0xffffffffffffffff;
  uVar19 = lVar17 + 8;
  if ((long)uVar21 < 0) {
    uVar19 = uVar18;
  }
  puVar15 = (ulong *)operator_new__(uVar19);
  *puVar15 = uVar21;
  if (uVar21 != 0) {
    puVar16 = puVar15 + 3;
    do {
      puVar16[-2] = (ulong)puVar16;
      puVar16[-1] = 0;
      *(undefined1 *)puVar16 = 0;
      puVar16 = puVar16 + 4;
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != 0);
  }
  this->pto = (TestArrObj *)(puVar15 + 1);
  lVar17 = 0;
  uVar19 = 0;
  while( true ) {
    iVar20 = (int)uVar21;
    if ((ulong)(long)iVar20 <= uVar19) break;
    TestArrObj::SetVal((TestArrObj *)((long)&(this->pto->str)._M_dataplus._M_p + lVar17));
    uVar19 = uVar19 + 1;
    uVar21 = (ulong)(uint)this->SIZE;
    lVar17 = lVar17 + 0x20;
  }
  uVar19 = (long)iVar20 * 4;
  if (iVar20 < 0) {
    uVar19 = uVar18;
  }
  piVar6 = (int *)operator_new__(uVar19);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&_Stack_38,piVar6);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  peVar1 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = 0;
  while( true ) {
    iVar20 = this->SIZE;
    uVar21 = (ulong)iVar20;
    if (uVar21 <= uVar19) break;
    peVar1[uVar19] = 10;
    uVar19 = uVar19 + 1;
  }
  lVar17 = uVar21 * 0x20;
  uVar19 = lVar17 + 8;
  if (iVar20 < 0) {
    uVar19 = uVar18;
  }
  puVar15 = (ulong *)operator_new__(uVar19);
  *puVar15 = uVar21;
  if (iVar20 != 0) {
    puVar16 = puVar15 + 3;
    do {
      puVar16[-2] = (ulong)puVar16;
      puVar16[-1] = 0;
      *(undefined1 *)puVar16 = 0;
      puVar16 = puVar16 + 4;
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != 0);
  }
  std::__shared_ptr<TestArrObj,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<TestArrObj,std::default_delete<TestArrObj[]>,void>
            ((__shared_ptr<TestArrObj,(__gnu_cxx::_Lock_policy)2> *)&_Stack_38,puVar15 + 1);
  std::__shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  lVar17 = 0;
  for (uVar18 = 0; uVar18 < (ulong)(long)this->SIZE; uVar18 = uVar18 + 1) {
    TestArrObj::SetVal((TestArrObj *)
                       ((long)&(((this->spto).
                                 super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->str)._M_dataplus._M_p + lVar17));
    lVar17 = lVar17 + 0x20;
  }
  return;
}

Assistant:

void AddValues()
        {
            c = 0xFF;
            uc = 0xFF;
            s = 0xFFFF;
            us = 0xFFFF;
            i = 0xFFFFF;
            ui = 0xFFFFF;
            l = 0xFFFFF;
            ul = 0xFFFFF;
            ll = 0xFFFFF;
            ull = 0xFFFFF;
            f = 1.342323;
            d = 432.324324324;
            ld = 423432.3465435435;

            str = new char[strlen("Hello World!") + 1];
            strcpy(str, "Hello World!");
            str[strlen("Hello World!")] = '\0';

            pc = FillValues<char *>();
            puc = FillValues<unsigned char *>();
            ps = FillValues<short *>();
            pus = FillValues<unsigned short *>();
            pi = FillValues<int *>();
            pui = FillValues<unsigned int *>();
            pl = FillValues<long *>();
            pul = FillValues<unsigned long *>();
            pll = FillValues<long long *>();
            pull = FillValues<unsigned long long *>();
            pf = FillValues<float *>();
            pd = FillValues<double *>();
            pld = FillValues<long double *>();

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i].SetVal();
            }
            
            spi = shared_ptr<int>(new int[SIZE]);
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spi)[i] = 10;
            }

            spto = shared_ptr<TestArrObj>(new TestArrObj[SIZE], default_delete<TestArrObj[]>());
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spto)[i].SetVal();
            }   
        }